

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_loadDictionaryContent
                 (ZSTD_matchState_t *ms,ldmState_t *ls,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,
                 void *src,size_t srcSize,ZSTD_dictTableLoadMethod_e dtlm,
                 ZSTD_tableFillPurpose_e tfp)

{
  ZSTD_window_t window;
  ZSTD_window_t window_00;
  ZSTD_compressionParameters cParams1;
  ZSTD_compressionParameters cParams2;
  uint uVar1;
  int iVar2;
  U32 UVar3;
  uint uVar4;
  long in_RCX;
  undefined1 (*in_RSI) [28];
  undefined1 (*in_RDI) [28];
  ldmState_t *in_R8;
  ulong in_R9;
  int in_stack_00000010;
  size_t tagTableSize;
  U32 maxDictSize_1;
  U32 shortCacheMaxDictSize;
  int CDictTaggedIndices;
  U32 maxDictSize;
  int loadLdmDict;
  BYTE *iend;
  BYTE *ip;
  BYTE *iend_00;
  ZSTD_matchState_t *ms_00;
  ZSTD_matchState_t *ms_01;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff34;
  ZSTD_matchState_t *ms_02;
  int forceNonContiguous;
  ZSTD_strategy ZVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffff54;
  ZSTD_window_t *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  ZSTD_strategy in_stack_ffffffffffffff68;
  ZSTD_strategy in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  bool local_81;
  uint local_6c;
  ZSTD_matchState_t *params_00;
  undefined4 uVar9;
  BYTE *ip_00;
  ulong local_38;
  
  ip_00 = (BYTE *)((long)in_R8->splitIndices + (in_R9 - 0x40));
  local_81 = *(int *)(in_RCX + 0x60) == 1 && in_RSI != (undefined1 (*) [28])0x0;
  uVar1 = (uint)local_81;
  iend_00 = *(BYTE **)(in_RCX + 4);
  ms_00 = *(ZSTD_matchState_t **)(in_RCX + 0xc);
  ms_01 = *(ZSTD_matchState_t **)(in_RCX + 0x14);
  uVar5 = *(undefined4 *)(in_RCX + 0x1c);
  ms_02 = *(ZSTD_matchState_t **)(in_RDI[9] + 4);
  forceNonContiguous = (int)((ulong)*(undefined8 *)(in_RDI[9] + 0xc) >> 0x20);
  ZVar6 = (ZSTD_strategy)*(undefined8 *)(in_RDI[9] + 0x14);
  uVar7 = (undefined4)((ulong)*(undefined8 *)(in_RDI[9] + 0x14) >> 0x20);
  uVar8 = *(undefined4 *)in_RDI[10];
  cParams1.chainLog = in_stack_ffffffffffffff34;
  cParams1.windowLog = uVar5;
  cParams1._8_8_ = ms_02;
  cParams1.minMatch = (int)*(undefined8 *)(in_RDI[9] + 0xc);
  cParams1.targetLength = forceNonContiguous;
  cParams1.strategy = ZVar6;
  cParams2.chainLog = in_stack_ffffffffffffff54;
  cParams2.windowLog = uVar8;
  cParams2._8_8_ = in_stack_ffffffffffffff58;
  cParams2.minMatch = in_stack_ffffffffffffff60;
  cParams2.targetLength = in_stack_ffffffffffffff64;
  cParams2.strategy = in_stack_ffffffffffffff68;
  params_00 = ms_01;
  uVar9 = uVar5;
  ZSTD_assertEqualCParams(cParams1,cParams2);
  local_6c = 0xdffffffe;
  iVar2 = ZSTD_CDictIndicesAreTagged((ZSTD_compressionParameters *)(in_RCX + 4));
  if (((iVar2 != 0) && (in_stack_00000010 == 1)) && (local_6c = 0xfffffe, uVar1 != 0)) {
    __assert_fail("!loadLdmDict",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6322,
                  "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                 );
  }
  local_38 = in_R9;
  if (local_6c < in_R9) {
    in_R8 = (ldmState_t *)(ip_00 + -(ulong)local_6c);
    local_38 = (ulong)local_6c;
  }
  if (0x1fffffff < local_38) {
    ms_02 = *(ZSTD_matchState_t **)(in_RDI[1] + 4);
    iend_00 = *(BYTE **)*in_RDI;
    ms_00 = *(ZSTD_matchState_t **)(*in_RDI + 8);
    ms_01 = *(ZSTD_matchState_t **)(*in_RDI + 0x10);
    uVar5 = (undefined4)*(undefined8 *)(*in_RDI + 0x18);
    in_stack_ffffffffffffff34 = (undefined4)((ulong)*(undefined8 *)(*in_RDI + 0x18) >> 0x20);
    window.lowLimit = in_stack_ffffffffffffff34;
    window._0_28_ = *in_RDI;
    window._32_8_ = ms_02;
    UVar3 = ZSTD_window_isEmpty(window);
    if (UVar3 == 0) {
      __assert_fail("ZSTD_window_isEmpty(ms->window)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x632f,
                    "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                   );
    }
    if (uVar1 != 0) {
      ms_02 = *(ZSTD_matchState_t **)(in_RSI[1] + 4);
      iend_00 = *(BYTE **)*in_RSI;
      ms_00 = *(ZSTD_matchState_t **)(*in_RSI + 8);
      ms_01 = *(ZSTD_matchState_t **)(*in_RSI + 0x10);
      uVar5 = (undefined4)*(undefined8 *)(*in_RSI + 0x18);
      in_stack_ffffffffffffff34 = (undefined4)((ulong)*(undefined8 *)(*in_RSI + 0x18) >> 0x20);
      window_00.lowLimit = in_stack_ffffffffffffff34;
      window_00._0_28_ = *in_RSI;
      window_00._32_8_ = ms_02;
      UVar3 = ZSTD_window_isEmpty(window_00);
      if (UVar3 == 0) {
        __assert_fail("ZSTD_window_isEmpty(ls->window)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x6330,
                      "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                     );
      }
    }
  }
  ZSTD_window_update(in_stack_ffffffffffffff58,(void *)CONCAT44(in_stack_ffffffffffffff54,uVar8),
                     CONCAT44(uVar7,ZVar6),forceNonContiguous);
  if (uVar1 != 0) {
    ZSTD_window_update(in_stack_ffffffffffffff58,(void *)CONCAT44(in_stack_ffffffffffffff54,uVar8),
                       CONCAT44(uVar7,ZVar6),forceNonContiguous);
    if (*(int *)(in_RCX + 0x30) == 0) {
      in_stack_ffffffffffffff74 = (int)ip_00 - (int)*(undefined8 *)(*in_RSI + 8);
    }
    else {
      in_stack_ffffffffffffff74 = 0;
    }
    *(int *)(in_RSI[1] + 0x14) = in_stack_ffffffffffffff74;
    ZSTD_ldm_fillHashTable(in_R8,ip_00,(BYTE *)CONCAT44(uVar1,uVar9),(ldmParams_t *)params_00);
  }
  if (*(uint *)(in_RCX + 0x1c) < 8) {
    if (*(uint *)(in_RCX + 8) < *(uint *)(in_RCX + 0xc)) {
      in_stack_ffffffffffffff70 = *(uint *)(in_RCX + 0xc);
    }
    else {
      in_stack_ffffffffffffff70 = *(uint *)(in_RCX + 8);
    }
    if (in_stack_ffffffffffffff70 < 0x1c) {
      if (*(uint *)(in_RCX + 8) < *(uint *)(in_RCX + 0xc)) {
        in_stack_ffffffffffffff68 = *(ZSTD_strategy *)(in_RCX + 0xc);
        in_stack_ffffffffffffff6c = in_stack_ffffffffffffff68;
      }
      else {
        in_stack_ffffffffffffff68 = *(ZSTD_strategy *)(in_RCX + 8);
        in_stack_ffffffffffffff6c = in_stack_ffffffffffffff68;
      }
    }
    else {
      in_stack_ffffffffffffff68 = 0x1c;
    }
    uVar4 = 8 << ((byte)in_stack_ffffffffffffff68 & 0x1f);
    if (uVar4 < local_38) {
      in_R8 = (ldmState_t *)(ip_00 + -(ulong)uVar4);
      local_38 = (ulong)uVar4;
    }
  }
  *(int *)(in_RDI[1] + 0x10) = (int)in_R8 - (int)*(undefined8 *)(*in_RDI + 8);
  if (*(int *)(in_RCX + 0x30) == 0) {
    iVar2 = (int)ip_00 - (int)*(undefined8 *)(*in_RDI + 8);
  }
  else {
    iVar2 = 0;
  }
  *(int *)(in_RDI[1] + 0xc) = iVar2;
  *(undefined4 *)(in_RDI[4] + 0x18) = *(undefined4 *)(in_RCX + 0x94);
  if (8 < local_38) {
    ZSTD_overflowCorrectIfNeeded
              ((ZSTD_matchState_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (ZSTD_cwksp *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (ZSTD_CCtx_params *)CONCAT44(iVar2,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58,(void *)CONCAT44(in_stack_ffffffffffffff54,uVar8));
    switch(*(undefined4 *)(in_RCX + 0x1c)) {
    case 1:
      ZSTD_fillHashTable(ms_00,iend_00,ZSTD_dtlm_fast,0x32fc8f);
      iVar2 = (int)ip_00;
      break;
    case 2:
      ZSTD_fillDoubleHashTable(ms_00,iend_00,ZSTD_dtlm_fast,0x32fcb7);
      iVar2 = (int)ip_00;
      break;
    case 3:
    case 4:
    case 5:
      if (local_38 < 8) {
        __assert_fail("srcSize >= HASH_READ_SIZE",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x635a,
                      "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                     );
      }
      if (*(int *)in_RDI[5] == 0) {
        if (*(int *)(in_RCX + 0x90) == 0) {
          __assert_fail("params->useRowMatchFinder != ZSTD_ps_auto",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x635f,
                        "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                       );
        }
        if (*(int *)(in_RCX + 0x90) == 1) {
          memset(*(void **)in_RDI[2],0,1L << ((byte)*(undefined4 *)(in_RCX + 0xc) & 0x3f));
          iVar2 = (int)ip_00;
          ZSTD_row_update((ZSTD_matchState_t *)CONCAT44(uVar1,uVar9),(BYTE *)params_00);
        }
        else {
          ZSTD_insertAndFindFirstIndex(ms_02,(BYTE *)CONCAT44(in_stack_ffffffffffffff34,uVar5));
          iVar2 = (int)ip_00;
        }
      }
      else {
        if (*(long *)(in_RDI[4] + 0x10) == 0) {
          __assert_fail("ms->chainTable != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x635c,
                        "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                       );
        }
        ZSTD_dedicatedDictSearch_lazy_loadDictionary((ZSTD_matchState_t *)in_R8,ip_00);
        iVar2 = (int)ip_00;
      }
      break;
    case 6:
    case 7:
    case 8:
    case 9:
      if (local_38 < 8) {
        __assert_fail("srcSize >= HASH_READ_SIZE",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x6370,
                      "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                     );
      }
      ZSTD_updateTree(ms_01,(BYTE *)ms_00,iend_00);
      iVar2 = (int)ip_00;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6375,
                    "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                   );
    }
    *(int *)(in_RDI[1] + 0x10) = iVar2 - (int)*(undefined8 *)(*in_RDI + 8);
  }
  return 0;
}

Assistant:

static size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t* ms,
                                         ldmState_t* ls,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         const void* src, size_t srcSize,
                                         ZSTD_dictTableLoadMethod_e dtlm,
                                         ZSTD_tableFillPurpose_e tfp)
{
    const BYTE* ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    int const loadLdmDict = params->ldmParams.enableLdm == ZSTD_ps_enable && ls != NULL;

    /* Assert that the ms params match the params we're being given */
    ZSTD_assertEqualCParams(params->cParams, ms->cParams);

    {   /* Ensure large dictionaries can't cause index overflow */

        /* Allow the dictionary to set indices up to exactly ZSTD_CURRENT_MAX.
         * Dictionaries right at the edge will immediately trigger overflow
         * correction, but I don't want to insert extra constraints here.
         */
        U32 maxDictSize = ZSTD_CURRENT_MAX - ZSTD_WINDOW_START_INDEX;

        int const CDictTaggedIndices = ZSTD_CDictIndicesAreTagged(&params->cParams);
        if (CDictTaggedIndices && tfp == ZSTD_tfp_forCDict) {
            /* Some dictionary matchfinders in zstd use "short cache",
             * which treats the lower ZSTD_SHORT_CACHE_TAG_BITS of each
             * CDict hashtable entry as a tag rather than as part of an index.
             * When short cache is used, we need to truncate the dictionary
             * so that its indices don't overlap with the tag. */
            U32 const shortCacheMaxDictSize = (1u << (32 - ZSTD_SHORT_CACHE_TAG_BITS)) - ZSTD_WINDOW_START_INDEX;
            maxDictSize = MIN(maxDictSize, shortCacheMaxDictSize);
            assert(!loadLdmDict);
        }

        /* If the dictionary is too large, only load the suffix of the dictionary. */
        if (srcSize > maxDictSize) {
            ip = iend - maxDictSize;
            src = ip;
            srcSize = maxDictSize;
        }
    }

    if (srcSize > ZSTD_CHUNKSIZE_MAX) {
        /* We must have cleared our windows when our source is this large. */
        assert(ZSTD_window_isEmpty(ms->window));
        if (loadLdmDict) assert(ZSTD_window_isEmpty(ls->window));
    }
    ZSTD_window_update(&ms->window, src, srcSize, /* forceNonContiguous */ 0);

    DEBUGLOG(4, "ZSTD_loadDictionaryContent(): useRowMatchFinder=%d", (int)params->useRowMatchFinder);

    if (loadLdmDict) { /* Load the entire dict into LDM matchfinders. */
        ZSTD_window_update(&ls->window, src, srcSize, /* forceNonContiguous */ 0);
        ls->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ls->window.base);
        ZSTD_ldm_fillHashTable(ls, ip, iend, &params->ldmParams);
    }

    /* If the dict is larger than we can reasonably index in our tables, only load the suffix. */
    if (params->cParams.strategy < ZSTD_btultra) {
        U32 maxDictSize = 8U << MIN(MAX(params->cParams.hashLog, params->cParams.chainLog), 28);
        if (srcSize > maxDictSize) {
            ip = iend - maxDictSize;
            src = ip;
            srcSize = maxDictSize;
        }
    }

    ms->nextToUpdate = (U32)(ip - ms->window.base);
    ms->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ms->window.base);
    ms->forceNonContiguous = params->deterministicRefPrefix;

    if (srcSize <= HASH_READ_SIZE) return 0;

    ZSTD_overflowCorrectIfNeeded(ms, ws, params, ip, iend);

    switch(params->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, iend, dtlm, tfp);
        break;
    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, iend, dtlm, tfp);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
        assert(srcSize >= HASH_READ_SIZE);
        if (ms->dedicatedDictSearch) {
            assert(ms->chainTable != NULL);
            ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms, iend-HASH_READ_SIZE);
        } else {
            assert(params->useRowMatchFinder != ZSTD_ps_auto);
            if (params->useRowMatchFinder == ZSTD_ps_enable) {
                size_t const tagTableSize = ((size_t)1 << params->cParams.hashLog);
                ZSTD_memset(ms->tagTable, 0, tagTableSize);
                ZSTD_row_update(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using row-based hash table for lazy dict");
            } else {
                ZSTD_insertAndFindFirstIndex(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using chain-based hash table for lazy dict");
            }
        }
        break;

    case ZSTD_btlazy2:   /* we want the dictionary table fully sorted */
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
        assert(srcSize >= HASH_READ_SIZE);
        ZSTD_updateTree(ms, iend-HASH_READ_SIZE, iend);
        break;

    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    ms->nextToUpdate = (U32)(iend - ms->window.base);
    return 0;
}